

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

CVmUndoMeta * __thiscall CVmUndo::alloc_rec(CVmUndo *this)

{
  CVmUndoMeta *pCVar1;
  CVmUndo *in_RDI;
  CVmUndoMeta *ret;
  CVmUndo *this_00;
  
  this_00 = in_RDI;
  while ((in_RDI->savept_cnt_ != 0 && (in_RDI->next_free_ == in_RDI->oldest_first_))) {
    if (in_RDI->savept_cnt_ < 2) {
      drop_oldest_savept(this_00);
      return (CVmUndoMeta *)0x0;
    }
    drop_oldest_savept(this_00);
  }
  pCVar1 = in_RDI->next_free_;
  inc_rec_ptr(in_RDI,&in_RDI->next_free_);
  return pCVar1;
}

Assistant:

CVmUndoMeta *CVmUndo::alloc_rec(VMG0_)
{
    /* 
     *   keep trying until we find an entry or run out of savepoints to
     *   delete 
     */
    for (;;)
    {
        /*
         *   If we have no savepoints at all, all records are free.
         *   Otherwise, if the next free pointer hasn't bumped up against
         *   the oldest allocated record yet, we can allocate another
         *   record.  
         */
        if (savept_cnt_ == 0 || next_free_ != oldest_first_)
        {
            CVmUndoMeta *ret;
            
            /* remember the current free record */
            ret = next_free_;

            /* 
             *   advance to the next record, wrapping if we reach the end
             *   of the array (since we treat the array as circular) 
             */
            inc_rec_ptr(&next_free_);

            /* return the record */
            return ret;
        }
        
        /* 
         *   If we have at least one old savepoint, discard the oldest
         *   savepoint, which may free up some records, and try again;
         *   otherwise, give up.  
         */
        if (savept_cnt_ > 1)
        {
            /* 
             *   we have at least one old savepoint we can discard - get
             *   rid of it and try again 
             */
            drop_oldest_savept(vmg0_);
        }
        else
        {
            /* 
             *   we are down to our last savepoint (or none at all) - it's
             *   no longer valid (since we can't keep it complete due to
             *   the lack of available records), so delete it and return
             *   failure 
             */
            drop_oldest_savept(vmg0_);
            return 0;
        }
    }
}